

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::ConsumeLineComment(Tokenizer *this,string *content)

{
  bool bVar1;
  string *content_local;
  Tokenizer *this_local;
  
  if (content != (string *)0x0) {
    RecordTo(this,content);
  }
  while( true ) {
    bVar1 = false;
    if (this->current_char_ != '\0') {
      bVar1 = this->current_char_ != '\n';
    }
    if (!bVar1) break;
    NextChar(this);
  }
  TryConsume(this,'\n');
  if (content != (string *)0x0) {
    StopRecording(this);
  }
  return;
}

Assistant:

void Tokenizer::ConsumeLineComment(std::string* content) {
  if (content != nullptr) RecordTo(content);

  while (current_char_ != '\0' && current_char_ != '\n') {
    NextChar();
  }
  TryConsume('\n');

  if (content != nullptr) StopRecording();
}